

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O0

void __thiscall chrono::ChFrame<double>::ChFrame(ChFrame<double> *this,ChCoordsys<double> *mc)

{
  ChCoordsys<double> *mc_local;
  ChFrame<double> *this_local;
  
  this->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_002edad8;
  ChCoordsys<double>::ChCoordsys(&this->coord,mc);
  ChMatrix33<double>::ChMatrix33(&this->Amatrix,&mc->rot);
  return;
}

Assistant:

explicit ChFrame(const ChCoordsys<Real>& mc) : coord(mc), Amatrix(mc.rot) {}